

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::WildcardPattern::matches(WildcardPattern *this,string *str)

{
  string *prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  logic_error *this_00;
  long in_RDI;
  string *in_stack_ffffffffffffff18;
  string *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  string *in_stack_ffffffffffffff58;
  string *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff68;
  string local_88 [48];
  string local_58 [32];
  string local_38 [55];
  byte local_1;
  
  prefix = (string *)(ulong)*(uint *)(in_RDI + 0xc);
  switch(prefix) {
  case (string *)0x0:
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x10);
    adjustCase((WildcardPattern *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
               in_stack_ffffffffffffff20);
    local_1 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38)
                             );
    std::__cxx11::string::~string(local_38);
    break;
  case (string *)0x1:
    adjustCase((WildcardPattern *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
               in_stack_ffffffffffffff20);
    local_1 = endsWith(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    std::__cxx11::string::~string(local_58);
    break;
  case (string *)0x2:
    adjustCase((WildcardPattern *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
               local_88);
    local_1 = startsWith(in_stack_ffffffffffffff58,prefix);
    std::__cxx11::string::~string((string *)local_88);
    break;
  case (string *)0x3:
    adjustCase((WildcardPattern *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
               in_stack_ffffffffffffff20);
    local_1 = contains(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Unknown enum");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return (bool)(local_1 & 1);
}

Assistant:

virtual bool matches( std::string const& str ) const {
            switch( m_wildcard ) {
                case NoWildcard:
                    return m_pattern == adjustCase( str );
                case WildcardAtStart:
                    return endsWith( adjustCase( str ), m_pattern );
                case WildcardAtEnd:
                    return startsWith( adjustCase( str ), m_pattern );
                case WildcardAtBothEnds:
                    return contains( adjustCase( str ), m_pattern );
            }

#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wunreachable-code"
#endif
            throw std::logic_error( "Unknown enum" );
#ifdef __clang__
#pragma clang diagnostic pop
#endif
        }